

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::DistantLight>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               DistantLight *light,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  Attribute *this;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  size_type sVar6;
  mapped_type *this_00;
  ostream *poVar7;
  string *name;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool local_b39;
  bool local_b11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_af8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad8 [32];
  string local_ab8 [32];
  ostringstream local_a98 [8];
  ostringstream ss_w_2;
  allocator local_8f9;
  value_type local_8f8 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_8d8;
  allocator local_8b1;
  string local_8b0;
  undefined1 local_890 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun_1;
  Attribute *attr_2;
  allocator local_851;
  value_type local_850 [4];
  Attribute *local_830;
  Attribute *attr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808 [32];
  ostringstream local_7e8 [8];
  ostringstream ss_w_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  string local_650;
  allocator local_629;
  key_type local_628 [4];
  _Base_ptr local_608;
  undefined1 local_600;
  allocator local_5f1;
  value_type local_5f0 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5d0;
  allocator local_5a9;
  string local_5a8;
  undefined1 local_588 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  allocator local_549;
  value_type local_548 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508 [32];
  ostringstream local_4e8 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  allocator local_329;
  key_type local_328 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  string local_2a0;
  ostringstream local_280 [8];
  ostringstream ss_e;
  allocator local_101;
  string local_100;
  string local_e0;
  undefined1 local_c0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  DistantLight *light_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  bVar1 = ReconstructXformOpsFromProperties
                    (spec,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)light,
                     (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar1) {
    __end2 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             ::begin(properties);
    prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
            *)::std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::end(properties);
    while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
      ret.err.field_2._8_8_ =
           ::std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
           ::operator*(&__end2);
      ::std::__cxx11::string::string((string *)&local_e0,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_100,"inputs:angle",&local_101);
      name = &local_100;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_c0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_e0,pPVar3,name,&light->angle);
      ::std::__cxx11::string::~string((string *)&local_100);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
      ::std::__cxx11::string::~string((string *)&local_e0);
      if ((local_c0._0_4_ == Success) || (local_c0._0_4_ == AlreadyProcessed)) {
        __range2._4_4_ = 3;
      }
      else if (local_c0._0_4_ == Unmatched) {
        __range2._4_4_ = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_280);
        poVar7 = ::std::operator<<((ostream *)local_280,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd1e);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Parsing attribute `{}` failed. Error: {}",&local_2c1);
        fmt::format<char[13],std::__cxx11::string>
                  (&local_2a0,(fmt *)local_2c0,(string *)"inputs:angle",(char (*) [13])&ret,name);
        poVar7 = ::std::operator<<((ostream *)local_280,(string *)&local_2a0);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::__cxx11::string::~string(local_2c0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2e8,local_308);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_2e8);
          ::std::__cxx11::string::~string((string *)local_308);
        }
        spec_local._7_1_ = 0;
        __range2._4_4_ = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_280);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_c0);
      if (__range2._4_4_ == 0) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)ret.err.field_2._8_8_,"purpose");
        if (bVar1) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_328,"purpose",&local_329);
          sVar6 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_70,local_328);
          ::std::__cxx11::string::~string((string *)local_328);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_329);
          if (sVar6 == 0) {
            Property::value_type_name_abi_cxx11_
                      (&local_350,(Property *)(ret.err.field_2._8_8_ + 0x20));
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            _Var2 = ::std::operator==(&local_350,&local_370);
            local_b11 = false;
            if (_Var2) {
              bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              local_b11 = false;
              if (bVar1) {
                local_b11 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
              }
            }
            ::std::__cxx11::string::~string((string *)&local_370);
            ::std::__cxx11::string::~string((string *)&local_350);
            if (local_b11 == false) {
              fun._M_invoker =
                   (_Invoker_type)
                   Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
              ::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                        ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                          *)local_588,PurposeEnumHandler);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)&local_5a8,"purpose",&local_5a9);
              bVar1 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_5d0,
                         (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)local_588);
              bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                (&local_5a8,(bool)(bVar1 & 1),&local_5d0,(Attribute *)fun._M_invoker
                                 ,&(light->super_NonboundableLight).purpose,warn,
                                 (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function(&local_5d0);
              ::std::__cxx11::string::~string((string *)&local_5a8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
                pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                   (&(light->super_NonboundableLight).purpose);
                AttrMetas::operator=(pAVar5,pAVar4);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)local_5f0,"purpose",&local_5f1);
                pVar8 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_70,local_5f0);
                local_608 = (_Base_ptr)pVar8.first._M_node;
                local_600 = pVar8.second;
                ::std::__cxx11::string::~string((string *)local_5f0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
                __range2._4_4_ = 3;
              }
              else {
                spec_local._7_1_ = 0;
                __range2._4_4_ = 1;
              }
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                           *)local_588);
              goto joined_r0x002ba899;
            }
            ::std::__cxx11::ostringstream::ostringstream(local_4e8);
            poVar7 = ::std::operator<<((ostream *)local_4e8,"[warn]");
            poVar7 = ::std::operator<<(poVar7,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar7 = ::std::operator<<(poVar7,":");
            poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
            poVar7 = ::std::operator<<(poVar7,"():");
            poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd20);
            ::std::operator<<(poVar7," ");
            poVar7 = ::std::operator<<((ostream *)local_4e8,"No value assigned to `");
            poVar7 = ::std::operator<<(poVar7,"purpose");
            poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
            ::std::operator<<(poVar7,"\n");
            if (warn != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_508,local_528);
              ::std::__cxx11::string::operator=((string *)warn,(string *)local_508);
              ::std::__cxx11::string::~string((string *)local_508);
              ::std::__cxx11::string::~string((string *)local_528);
            }
            ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
            this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            pAVar4 = Attribute::metas(this);
            pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                               (&(light->super_NonboundableLight).purpose);
            AttrMetas::operator=(pAVar5,pAVar4);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_548,"purpose",&local_549);
            ::std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,local_548);
            ::std::__cxx11::string::~string((string *)local_548);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_549);
          }
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)ret.err.field_2._8_8_,"visibility");
          if (bVar1) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)local_628,"visibility",&local_629);
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,local_628);
            ::std::__cxx11::string::~string((string *)local_628);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_629);
            if (sVar6 == 0) {
              Property::value_type_name_abi_cxx11_
                        (&local_650,(Property *)(ret.err.field_2._8_8_ + 0x20));
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var2 = ::std::operator==(&local_650,&local_670);
              local_b39 = false;
              if (_Var2) {
                bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                local_b39 = false;
                if (bVar1) {
                  local_b39 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
                }
              }
              ::std::__cxx11::string::~string((string *)&local_670);
              ::std::__cxx11::string::~string((string *)&local_650);
              if (local_b39 == false) {
                fun_1._M_invoker =
                     (_Invoker_type)
                     Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                ::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                          ((function<nonstd::expected_lite::expected<tinyusdz::Visibility,std::__cxx11::string>(std::__cxx11::string_const&)>
                            *)local_890,VisibilityEnumHandler);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string((string *)&local_8b0,"visibility",&local_8b1);
                bVar1 = options->strict_allowedToken_check;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_8d8,
                           (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)local_890);
                bVar1 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  (&local_8b0,(bool)(bVar1 & 1),&local_8d8,
                                   (Attribute *)fun_1._M_invoker,
                                   &(light->super_NonboundableLight).visibility,warn,
                                   (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count)
                ;
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function(&local_8d8);
                ::std::__cxx11::string::~string((string *)&local_8b0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  pAVar4 = Attribute::metas((Attribute *)fun_1._M_invoker);
                  pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                           metas(&(light->super_NonboundableLight).visibility);
                  AttrMetas::operator=(pAVar5,pAVar4);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string((string *)local_8f8,"visibility",&local_8f9);
                  ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_70,local_8f8);
                  ::std::__cxx11::string::~string((string *)local_8f8);
                  ::std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
                  __range2._4_4_ = 3;
                }
                else {
                  spec_local._7_1_ = 0;
                  __range2._4_4_ = 1;
                }
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::~function((function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                             *)local_890);
                goto joined_r0x002ba899;
              }
              ::std::__cxx11::ostringstream::ostringstream(local_7e8);
              poVar7 = ::std::operator<<((ostream *)local_7e8,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd22);
              ::std::operator<<(poVar7," ");
              poVar7 = ::std::operator<<((ostream *)local_7e8,"No value assigned to `");
              poVar7 = ::std::operator<<(poVar7,"visibility");
              poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
              ::std::operator<<(poVar7,"\n");
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_808,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&attr_1);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_808);
                ::std::__cxx11::string::~string((string *)local_808);
                ::std::__cxx11::string::~string((string *)&attr_1);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_7e8);
              local_830 = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
              pAVar4 = Attribute::metas(local_830);
              pAVar5 = TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
                       metas(&(light->super_NonboundableLight).visibility);
              AttrMetas::operator=(pAVar5,pAVar4);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_850,"visibility",&local_851);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,local_850);
              ::std::__cxx11::string::~string((string *)local_850);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_851);
            }
          }
          else {
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&(light->super_NonboundableLight).props,
                                     (key_type *)ret.err.field_2._8_8_);
              Property::operator=(this_00,pPVar3);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70,(value_type *)ret.err.field_2._8_8_);
            }
            sVar6 = ::std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_70,(key_type *)ret.err.field_2._8_8_);
            if (sVar6 == 0) {
              ::std::__cxx11::ostringstream::ostringstream(local_a98);
              poVar7 = ::std::operator<<((ostream *)local_a98,"[warn]");
              poVar7 = ::std::operator<<(poVar7,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar7 = ::std::operator<<(poVar7,":");
              poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
              poVar7 = ::std::operator<<(poVar7,"():");
              poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0xd24);
              ::std::operator<<(poVar7," ");
              ::std::operator+((char *)local_ab8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Unsupported/unimplemented property: ");
              poVar7 = ::std::operator<<((ostream *)local_a98,local_ab8);
              ::std::operator<<(poVar7,"\n");
              ::std::__cxx11::string::~string(local_ab8);
              if (warn != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_ad8,local_af8);
                ::std::__cxx11::string::operator=((string *)warn,(string *)local_ad8);
                ::std::__cxx11::string::~string((string *)local_ad8);
                ::std::__cxx11::string::~string((string *)local_af8);
              }
              ::std::__cxx11::ostringstream::~ostringstream(local_a98);
            }
          }
        }
      }
      else {
joined_r0x002ba899:
        if (__range2._4_4_ != 3) goto LAB_002baf13;
      }
      ::std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
      ::operator++(&__end2);
    }
    spec_local._7_1_ = 1;
  }
  else {
    spec_local._7_1_ = 0;
  }
LAB_002baf13:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<DistantLight>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    DistantLight *light,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)references;
  (void)options;

  std::set<std::string> table;

  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &light->xformOps, err)) {
    return false;
  }

  for (const auto &prop : properties) {
    // PARSE_PROPERTY(prop, "inputs:colorTemperature", light->colorTemperature)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:angle", DistantLight, light->angle)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, DistantLight,
                       light->purpose, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, DistantLight,
                   light->visibility, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, SphereLight, light->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}